

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O0

void __thiscall cmTarget::CheckProperty(cmTarget *this,string *prop,cmMakefile *context)

{
  bool bVar1;
  string *psVar2;
  string_view sVar3;
  cmValue local_58;
  cmValue value_2;
  cmValue value_1;
  cmValue local_38;
  cmValue value;
  cmMakefile *context_local;
  string *prop_local;
  cmTarget *this_local;
  
  sVar3 = (string_view)std::__cxx11::string::operator_cast_to_basic_string_view((string *)prop);
  value.Value = (string *)sVar3._M_len;
  bVar1 = cmHasLiteralPrefix<25ul>(sVar3,(char (*) [25])0x112953e);
  if (bVar1) {
    local_38 = GetProperty(this,prop);
    bVar1 = cmValue::operator_cast_to_bool(&local_38);
    if (bVar1) {
      psVar2 = cmValue::operator*[abi_cxx11_(&local_38);
      anon_unknown.dwarf_921bba::CheckLINK_INTERFACE_LIBRARIES(prop,psVar2,context,false);
    }
  }
  else {
    sVar3 = (string_view)std::__cxx11::string::operator_cast_to_basic_string_view((string *)prop);
    bVar1 = cmHasLiteralPrefix<34ul>(sVar3,(char (*) [34])"IMPORTED_LINK_INTERFACE_LIBRARIES");
    if (bVar1) {
      value_2 = GetProperty(this,prop);
      bVar1 = cmValue::operator_cast_to_bool(&value_2);
      if (bVar1) {
        psVar2 = cmValue::operator*[abi_cxx11_(&value_2);
        anon_unknown.dwarf_921bba::CheckLINK_INTERFACE_LIBRARIES(prop,psVar2,context,true);
      }
    }
    else {
      bVar1 = std::operator==(prop,"INTERFACE_LINK_LIBRARIES");
      if (bVar1) {
        local_58 = GetProperty(this,prop);
        bVar1 = cmValue::operator_cast_to_bool(&local_58);
        if (bVar1) {
          psVar2 = cmValue::operator*[abi_cxx11_(&local_58);
          anon_unknown.dwarf_921bba::CheckINTERFACE_LINK_LIBRARIES(psVar2,context);
        }
      }
      else {
        bVar1 = std::operator==(prop,"IMPORTED_GLOBAL");
        if ((bVar1) && (bVar1 = IsImported(this), bVar1)) {
          anon_unknown.dwarf_921bba::CheckIMPORTED_GLOBAL(this,context);
        }
      }
    }
  }
  return;
}

Assistant:

void cmTarget::CheckProperty(const std::string& prop,
                             cmMakefile* context) const
{
  // Certain properties need checking.
  if (cmHasLiteralPrefix(prop, "LINK_INTERFACE_LIBRARIES")) {
    if (cmValue value = this->GetProperty(prop)) {
      CheckLINK_INTERFACE_LIBRARIES(prop, *value, context, false);
    }
  } else if (cmHasLiteralPrefix(prop, "IMPORTED_LINK_INTERFACE_LIBRARIES")) {
    if (cmValue value = this->GetProperty(prop)) {
      CheckLINK_INTERFACE_LIBRARIES(prop, *value, context, true);
    }
  } else if (prop == "INTERFACE_LINK_LIBRARIES") {
    if (cmValue value = this->GetProperty(prop)) {
      CheckINTERFACE_LINK_LIBRARIES(*value, context);
    }
  } else if (prop == "IMPORTED_GLOBAL") {
    if (this->IsImported()) {
      CheckIMPORTED_GLOBAL(this, context);
    }
  }
}